

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_row.cpp
# Opt level: O2

iterator * __thiscall csv::CSVRow::iterator::operator--(iterator *this)

{
  size_t index;
  undefined1 auStack_58 [16];
  longdouble local_48;
  string_view local_38;
  undefined4 local_28;
  
  index = (long)this->i - 1;
  this->i = (int)index;
  local_38 = get_field(this->daddy,index);
  local_48 = (longdouble)0;
  local_28 = 0xffffffff;
  std::make_shared<csv::CSVField,csv::CSVField>((CSVField *)auStack_58);
  std::__shared_ptr<csv::CSVField,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->field).super___shared_ptr<csv::CSVField,_(__gnu_cxx::_Lock_policy)2>,
             (__shared_ptr<csv::CSVField,_(__gnu_cxx::_Lock_policy)2> *)auStack_58);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(auStack_58 + 8));
  return this;
}

Assistant:

CSV_INLINE CSVRow::iterator& CSVRow::iterator::operator--() {
        // Pre-decrement operator
        this->i--;
        this->field = std::make_shared<CSVField>(
            this->daddy->operator[](this->i));
        return *this;
    }